

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O0

void zsummer::log4z::FixPath(string *path)

{
  iterator iVar1;
  bool bVar2;
  ulong uVar3;
  reference pcVar4;
  char *pcVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  iterator iter;
  string *path_local;
  
  iter._M_current = (char *)path;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    local_18._M_current = (char *)std::__cxx11::string::begin();
    while( true ) {
      local_20._M_current = (char *)std::__cxx11::string::end();
      bVar2 = __gnu_cxx::operator!=(&local_18,&local_20);
      iVar1 = iter;
      if (!bVar2) break;
      pcVar4 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_18);
      if (*pcVar4 == '\\') {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_18);
        *pcVar4 = '/';
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_18);
    }
    std::__cxx11::string::length();
    pcVar5 = (char *)std::__cxx11::string::at(iVar1._M_current);
    if (*pcVar5 != '/') {
      std::__cxx11::string::operator+=((string *)iter._M_current,"/");
    }
  }
  return;
}

Assistant:

void FixPath(std::string &path)
{
	if (path.empty())
	{
		return;
	}
	for (std::string::iterator iter = path.begin(); iter != path.end(); ++iter)
	{
		if (*iter == '\\')
		{
			*iter = '/';
		}
	}
	if (path.at(path.length()-1) != '/')
	{
		path += "/";
	}
}